

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

time_t license::seconds_from_epoch(string *timeString)

{
  long lVar1;
  undefined8 uVar2;
  invalid_argument *piVar3;
  time_t tVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_74;
  int local_70;
  int nfield_2;
  int nfield_1;
  int local_5c;
  undefined1 local_58 [4];
  int nfield;
  tm tm;
  int local_18;
  int day;
  int month;
  int year;
  string *timeString_local;
  
  _month = timeString;
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 8) {
    uVar2 = std::__cxx11::string::c_str();
    local_5c = __isoc99_sscanf(uVar2,"%4d%2d%2d",&day,&local_18,
                               (undefined1 *)((long)&tm.tm_zone + 4));
    if (local_5c != 3) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"Date not recognized");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_5c = 3;
  }
  else {
    lVar1 = std::__cxx11::string::size();
    if (lVar1 != 10) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_100,"Date [",_month);
      std::operator+(&local_e0,&local_100,"] not recognized");
      std::invalid_argument::invalid_argument(piVar3,(string *)&local_e0);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    uVar2 = std::__cxx11::string::c_str();
    local_70 = __isoc99_sscanf(uVar2,"%4d-%2d-%2d",&day,&local_18,
                               (undefined1 *)((long)&tm.tm_zone + 4));
    if (local_70 != 3) {
      uVar2 = std::__cxx11::string::c_str();
      local_74 = __isoc99_sscanf(uVar2,"%4d/%2d/%2d",&day,&local_18,
                                 (undefined1 *)((long)&tm.tm_zone + 4));
      if (local_74 != 3) {
        local_b9 = 1;
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_b8,"Date [",_month);
        std::operator+(&local_98,&local_b8,"] not recognized");
        std::invalid_argument::invalid_argument(piVar3,(string *)&local_98);
        local_b9 = 0;
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      local_74 = 3;
    }
  }
  tm.tm_wday = -1;
  tm.tm_mday = day + -0x76c;
  tm.tm_hour = local_18 + -1;
  tm.tm_min = tm.tm_zone._4_4_;
  tm.tm_sec = 0;
  nfield = 0;
  local_58 = (undefined1  [4])0x0;
  tm.tm_year = -1;
  tm.tm_mon = -1;
  tVar4 = mktime((tm *)local_58);
  return tVar4;
}

Assistant:

time_t seconds_from_epoch(const string &timeString) {
	int year, month, day;
	tm tm;
	if (timeString.size() == 8) {
		const int nfield = sscanf(timeString.c_str(), "%4d%2d%2d", &year, &month, &day);
		if (nfield != 3) {
			throw invalid_argument("Date not recognized");
		}
	} else if (timeString.size() == 10) {
		const int nfield = sscanf(timeString.c_str(), "%4d-%2d-%2d", &year, &month, &day);
		if (nfield != 3) {
			const int nfield = sscanf(timeString.c_str(), "%4d/%2d/%2d", &year, &month, &day);
			if (nfield != 3) {
				throw invalid_argument("Date [" + timeString + "] not recognized");
			}
		}
	} else {
		throw invalid_argument("Date [" + timeString + "] not recognized");
	}
	tm.tm_isdst = -1;
	tm.tm_year = year - 1900;
	tm.tm_mon = month - 1;
	tm.tm_mday = day;
	tm.tm_hour = 0;
	tm.tm_min = 0;
	tm.tm_sec = 0;
	tm.tm_yday = -1;
	tm.tm_wday = -1;
	return mktime(&tm);
}